

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddMisc.c
# Opt level: O3

DdNode * extraTransferPermuteRecur
                   (DdManager *ddS,DdManager *ddD,DdNode *f,st__table *table,int *Permute)

{
  DdNode *pDVar1;
  int iVar2;
  DdNode *h;
  DdNode *pDVar3;
  long lVar4;
  ulong uVar5;
  int *piVar6;
  uint *key;
  DdNode *res;
  timespec ts;
  DdNode *local_68;
  DdNode *local_60;
  ulong local_58;
  DdNode *local_50;
  int *local_48;
  timespec local_40;
  
  pDVar1 = ddD->one;
  key = (uint *)((ulong)f & 0xfffffffffffffffe);
  uVar5 = (ulong)((uint)f & 1);
  if (*key == 0x7fffffff) {
    return (DdNode *)(uVar5 ^ (ulong)pDVar1);
  }
  local_48 = Permute;
  iVar2 = st__lookup(table,(char *)key,(char **)&local_68);
  if (iVar2 == 0) {
    if (ddS->TimeStop != 0) {
      iVar2 = clock_gettime(3,&local_40);
      if (iVar2 < 0) {
        lVar4 = -1;
      }
      else {
        lVar4 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
      }
      if (ddS->TimeStop < lVar4) {
        return (DdNode *)0x0;
      }
    }
    if (ddD->TimeStop != 0) {
      iVar2 = clock_gettime(3,&local_40);
      if (iVar2 < 0) {
        lVar4 = -1;
      }
      else {
        lVar4 = local_40.tv_nsec / 1000 + local_40.tv_sec * 1000000;
      }
      if (ddD->TimeStop < lVar4) {
        return (DdNode *)0x0;
      }
    }
    local_58 = (ulong)*key;
    if (local_48 == (int *)0x0) {
      pDVar3 = *(DdNode **)(key + 4);
      local_50 = *(DdNode **)(key + 6);
      piVar6 = (int *)0x0;
    }
    else {
      local_58 = (ulong)(uint)local_48[local_58];
      pDVar3 = *(DdNode **)(key + 4);
      local_50 = *(DdNode **)(key + 6);
      piVar6 = local_48;
    }
    local_60 = extraTransferPermuteRecur(ddS,ddD,pDVar3,table,piVar6);
    if (local_60 != (DdNode *)0x0) {
      piVar6 = (int *)(((ulong)local_60 & 0xfffffffffffffffe) + 4);
      *piVar6 = *piVar6 + 1;
      h = extraTransferPermuteRecur(ddS,ddD,local_50,table,local_48);
      pDVar3 = local_60;
      if (h != (DdNode *)0x0) {
        piVar6 = (int *)(((ulong)h & 0xfffffffffffffffe) + 4);
        *piVar6 = *piVar6 + 1;
        pDVar3 = cuddUniqueInter(ddD,(int)local_58,pDVar1,(DdNode *)((ulong)ddD->one ^ 1));
        pDVar1 = local_60;
        if ((pDVar3 == (DdNode *)0x0) ||
           (local_68 = cuddBddIteRecur(ddD,pDVar3,local_60,h), local_68 == (DdNode *)0x0)) {
          Cudd_RecursiveDeref(ddD,pDVar1);
          pDVar3 = h;
        }
        else {
          piVar6 = (int *)(((ulong)local_68 & 0xfffffffffffffffe) + 4);
          *piVar6 = *piVar6 + 1;
          Cudd_RecursiveDeref(ddD,pDVar1);
          Cudd_RecursiveDeref(ddD,h);
          iVar2 = st__add_direct(table,(char *)key,(char *)local_68);
          pDVar3 = local_68;
          if (iVar2 != -10000) {
            return (DdNode *)(uVar5 ^ (ulong)local_68);
          }
        }
      }
      Cudd_RecursiveDeref(ddD,pDVar3);
    }
    return (DdNode *)0x0;
  }
  return (DdNode *)(uVar5 ^ (ulong)local_68);
}

Assistant:

static DdNode * 
extraTransferPermuteRecur( 
  DdManager * ddS, 
  DdManager * ddD, 
  DdNode * f, 
  st__table * table, 
  int * Permute )
{
    DdNode *ft, *fe, *t, *e, *var, *res;
    DdNode *one, *zero;
    int index;
    int comple = 0;

    statLine( ddD );
    one = DD_ONE( ddD );
    comple = Cudd_IsComplement( f );

    /* Trivial cases. */
    if ( Cudd_IsConstant( f ) )
        return ( Cudd_NotCond( one, comple ) );


    /* Make canonical to increase the utilization of the cache. */
    f = Cudd_NotCond( f, comple );
    /* Now f is a regular pointer to a non-constant node. */

    /* Check the cache. */
    if ( st__lookup( table, ( char * ) f, ( char ** ) &res ) )
        return ( Cudd_NotCond( res, comple ) );

    if ( ddS->TimeStop && Abc_Clock() > ddS->TimeStop )
        return NULL;
    if ( ddD->TimeStop && Abc_Clock() > ddD->TimeStop )
        return NULL;

    /* Recursive step. */
    if ( Permute )
        index = Permute[f->index];
    else
        index = f->index;

    ft = cuddT( f );
    fe = cuddE( f );

    t = extraTransferPermuteRecur( ddS, ddD, ft, table, Permute );
    if ( t == NULL )
    {
        return ( NULL );
    }
    cuddRef( t );

    e = extraTransferPermuteRecur( ddS, ddD, fe, table, Permute );
    if ( e == NULL )
    {
        Cudd_RecursiveDeref( ddD, t );
        return ( NULL );
    }
    cuddRef( e );

    zero = Cudd_Not(ddD->one);
    var = cuddUniqueInter( ddD, index, one, zero );
    if ( var == NULL )
    {
        Cudd_RecursiveDeref( ddD, t );
        Cudd_RecursiveDeref( ddD, e );
        return ( NULL );
    }
    res = cuddBddIteRecur( ddD, var, t, e );

    if ( res == NULL )
    {
        Cudd_RecursiveDeref( ddD, t );
        Cudd_RecursiveDeref( ddD, e );
        return ( NULL );
    }
    cuddRef( res );
    Cudd_RecursiveDeref( ddD, t );
    Cudd_RecursiveDeref( ddD, e );

    if ( st__add_direct( table, ( char * ) f, ( char * ) res ) ==
         st__OUT_OF_MEM )
    {
        Cudd_RecursiveDeref( ddD, res );
        return ( NULL );
    }
    return ( Cudd_NotCond( res, comple ) );

}